

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Col_TraverseRopeChunks
              (Col_Word rope,size_t start,size_t max,int reverse,Col_RopeChunksTraverseProc *proc,
              Col_ClientData clientData,size_t *lengthPtr)

{
  int *chunkPtr;
  ushort uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  anon_struct_24_3_2a98ca8b *paVar9;
  undefined1 local_88 [8];
  RopeChunkTraverseInfo info;
  Col_Char2 *local_50;
  
  paVar9 = (anon_struct_24_3_2a98ca8b *)local_88;
  if (proc == (Col_RopeChunksTraverseProc *)0x0) {
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
    return -1;
  }
  if (rope == 0) {
    rope = 0;
  }
  else {
    if ((rope & 0xf) == 0) {
      if ((*(byte *)rope & 2) == 0) goto LAB_00108d94;
      uVar3 = *(byte *)rope & 0xfffffffe;
    }
    else {
      uVar3 = immediateWordTypes[(uint)rope & 0x1f];
    }
    if ((uVar3 == 2) && ((*(byte *)(rope + 2) & 0xc) == 0)) {
      rope = *(Col_Word *)(rope + 0x10);
    }
  }
LAB_00108d94:
  sVar5 = Col_RopeLength(rope);
  if (sVar5 == 0) {
    return -1;
  }
  if (reverse == 0) {
    uVar6 = sVar5 - start;
    if (sVar5 < start || uVar6 == 0) {
      return -1;
    }
    if (uVar6 < max) {
      max = uVar6;
    }
  }
  else {
    if (sVar5 <= start) {
      start = sVar5 - 1;
    }
    info.start = start + 1;
    if (info.start < max) goto LAB_00108de3;
  }
  info.start = max;
  if (info.start == 0) {
    return -1;
  }
LAB_00108de3:
  info.backtracks = (anon_struct_24_3_2a98ca8b *)rope;
  info._16_8_ = start;
  bVar2 = GetDepth(rope);
  info.max._0_4_ = (uint)bVar2;
  if (bVar2 == 0) {
    local_88 = (undefined1  [8])0x0;
  }
  else {
    local_88 = (undefined1  [8])(local_88 + -(ulong)((uint)bVar2 * 0x18 + 0xf & 0xfffffff0));
    paVar9 = (anon_struct_24_3_2a98ca8b *)local_88;
  }
  info.max._4_4_ = 0x7fffffff;
  chunkPtr = &info.maxDepth;
  while( true ) {
    paVar9[-1].max = 0x108e39;
    GetChunk((RopeChunkTraverseInfo *)local_88,(Col_RopeChunk *)chunkPtr,reverse);
    sVar5 = info.start;
    if (1 < info.maxDepth - 1U) {
      if (info.maxDepth == 0x12) {
        lVar8 = info.start - 1;
        uVar1 = *(ushort *)((long)&(info.backtracks)->prevDepth + 2);
        if (reverse == 0) {
          lVar8 = 0;
        }
        lVar8 = lVar8 - info._16_8_;
        sVar7 = (long)info.backtracks +
                ((ulong)*(ushort *)&(info.backtracks)->field_0x4 - (long)local_50) + 6;
        paVar9[-1].max = 0x108ed5;
        Col_Utf16Addr(local_50,sVar5,lVar8 + (ulong)uVar1,sVar7);
      }
      else if (info.maxDepth == 0x11) {
        uVar1 = *(ushort *)((long)&(info.backtracks)->prevDepth + 2);
        lVar8 = 0;
        if (reverse != 0) {
          lVar8 = info.start - 1;
        }
        lVar8 = lVar8 - info._16_8_;
        sVar7 = (long)info.backtracks +
                ((ulong)*(ushort *)&(info.backtracks)->field_0x4 - (long)local_50) + 6;
        paVar9[-1].max = 0x108e9a;
        Col_Utf8Addr((Col_Char1 *)local_50,sVar5,lVar8 + (ulong)uVar1,sVar7);
      }
    }
    if (lengthPtr != (size_t *)0x0) {
      *lengthPtr = *lengthPtr + sVar5;
    }
    if (reverse == 0) {
      paVar9[-1].max = 1;
      sVar7 = paVar9[-1].max;
      paVar9[-1].max = 0x108f1b;
      iVar4 = (*proc)(start,sVar5,sVar7,(Col_RopeChunk *)chunkPtr,clientData);
      start = start + sVar5;
    }
    else {
      start = start - sVar5;
      paVar9[-1].max = 1;
      sVar7 = paVar9[-1].max;
      paVar9[-1].max = 0x108f06;
      iVar4 = (*proc)(start + 1,sVar5,sVar7,(Col_RopeChunk *)chunkPtr,clientData);
    }
    if (iVar4 != 0) break;
    paVar9[-1].max = 0x108f30;
    NextChunk((RopeChunkTraverseInfo *)local_88,sVar5,reverse);
    if (info.backtracks == (anon_struct_24_3_2a98ca8b *)0x0) {
      return 0;
    }
  }
  return iVar4;
}

Assistant:

int
Col_TraverseRopeChunks(
    Col_Word rope,                      /*!< Rope to traverse. */
    size_t start,                       /*!< Index of first character. */
    size_t max,                         /*!< Max number of characters. */
    int reverse,                        /*!< Whether to traverse in reverse
                                             order. */
    Col_RopeChunksTraverseProc *proc,   /*!< Callback proc called on each
                                             chunk. */
    Col_ClientData clientData,          /*!< Opaque data passed as is to above
                                             **proc**. */

    /*! [in,out] If non-NULL, incremented by the total number of characters
                 traversed upon completion. */
    size_t *lengthPtr)
{
    RopeChunkTraverseInfo info;
    Col_RopeChunk chunk;
    int result;
    size_t ropeLength;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return -1;

    /*! @valuecheck{COL_ERROR_GENERIC,proc == NULL} */
    VALUECHECK(proc != NULL, COL_ERROR_GENERIC) return -1;

    WORD_UNWRAP(rope);

    ropeLength = Col_RopeLength(rope);
    if (ropeLength == 0) {
        /*
         * Nothing to traverse.
         */

        return -1;
    }

    if (reverse) {
        if (start >= ropeLength) {
            /*
             * Start is past the end of the rope.
             */

            start = ropeLength-1;
        }
        if (max > start+1) {
            /*
             * Adjust max to the remaining length.
             */

            max = start+1;
        }
    } else {
        if (start >= ropeLength) {
            /*
             * Start is past the end of the rope.
             */

            return -1;
        }
        if (max > ropeLength-start) {
            /*
             * Adjust max to the remaining length.
             */

            max = ropeLength-start;
        }
    }

    if (max == 0) {
        /*
         * Nothing to traverse.
         */

        return -1;
    }

    info.rope = rope;
    info.start = start;
    info.max = max;
    info.maxDepth = GetDepth(rope);
    info.backtracks = (info.maxDepth ?
            alloca(sizeof(*info.backtracks) * info.maxDepth) : NULL);
    info.prevDepth = INT_MAX;

    for (;;) {
        GetChunk(&info, &chunk, reverse);
        max = info.max;

        /*
         * Compute actual byte length.
         */

        switch (chunk.format) {
        case COL_UCS1:
        case COL_UCS2:
        case COL_UCS4:
            chunk.byteLength = max * CHAR_WIDTH(chunk.format);
            break;

        case COL_UTF8:
            chunk.byteLength = (const char *) Col_Utf8Addr(
                    (const Col_Char1 *) chunk.data, max, 
                    WORD_UTFSTR_LENGTH(info.rope) 
                    - (info.start - (reverse ? info.max-1 : 0)),
                    WORD_UTFSTR_BYTELENGTH(info.rope)
                    - ((const char *) chunk.data
                    - WORD_UTFSTR_DATA(info.rope)))
                    - (const char *) chunk.data;
            break;

        case COL_UTF16:
            chunk.byteLength = (const char *) Col_Utf16Addr(
                    (const Col_Char2 *) chunk.data, max, 
                    WORD_UTFSTR_LENGTH(info.rope) 
                    - (info.start - (reverse ? info.max-1 : 0)),
                    WORD_UTFSTR_BYTELENGTH(info.rope)
                    - ((const char *) chunk.data
                    - WORD_UTFSTR_DATA(info.rope)))
                    - (const char *) chunk.data;
            break;
        }

        /*
         * Call proc on leaf data.
         */

        if (lengthPtr) *lengthPtr += max;
        if (reverse) {
            result = proc(start-max+1, max, 1, &chunk, clientData);
            start -= max;
        } else {
            result = proc(start, max, 1, &chunk, clientData);
            start += max;
        }
        if (result != 0) {
            /*
             * Stop there.
             */

            return result;
        } else {
            /*
             * Continue iteration.
             */

            NextChunk(&info, max, reverse);
            if (!info.rope) {
                /*
                 * Reached end of rope, stop there.
                 */

                return 0;
            }
        }
    }
}